

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O2

void __thiscall
slang::parsing::Preprocessor::handleProtectSingleArgIgnore
          (Preprocessor *this,Token keyword,PragmaExpressionSyntax *args,
          SmallVectorBase<slang::parsing::Token> *param_3)

{
  Diagnostic *this_00;
  SourceRange range;
  string_view arg;
  Token local_18;
  
  local_18.info = keyword.info;
  local_18._0_8_ = keyword._0_8_;
  if (args == (PragmaExpressionSyntax *)0x0) {
    range = Token::range(&local_18);
  }
  else {
    if (((args->super_SyntaxNode).kind == SimplePragmaExpression) &&
       ((short)args[1].super_SyntaxNode.kind == AcceptOnPropertyExpr)) {
      return;
    }
    range = slang::syntax::SyntaxNode::sourceRange(&args->super_SyntaxNode);
  }
  this_00 = addDiag(this,(DiagCode)0x1f0004,range);
  arg = Token::valueText(&local_18);
  Diagnostic::operator<<(this_00,arg);
  return;
}

Assistant:

void Preprocessor::handleProtectSingleArgIgnore(Token keyword, const PragmaExpressionSyntax* args,
                                                SmallVectorBase<Token>&) {
    if (!args || args->kind != SyntaxKind::SimplePragmaExpression ||
        args->as<SimplePragmaExpressionSyntax>().value.kind != TokenKind::StringLiteral) {

        SourceRange range = args ? args->sourceRange() : keyword.range();
        addDiag(diag::ExpectedProtectArg, range) << keyword.valueText();
    }
}